

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idxset.cpp
# Opt level: O2

int __thiscall soplex::IdxSet::dim(IdxSet *this)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)this->num;
  if (this->num < 1) {
    uVar2 = uVar3;
  }
  iVar1 = -1;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    if (iVar1 <= this->idx[uVar3]) {
      iVar1 = this->idx[uVar3];
    }
  }
  return iVar1;
}

Assistant:

int IdxSet::dim() const
{
   int ddim = -1;

   for(int i = 0; i < size(); i++)
      if(ddim < idx[i])
         ddim = idx[i];

   return ddim;
}